

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O2

Real Diffusion::get_scaled_abs_tol(MultiFab *rhs,Real reduction)

{
  int iVar1;
  int comp;
  int comp_00;
  double dVar2;
  double dVar3;
  Real RVar4;
  
  iVar1 = (rhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  dVar2 = (double)iVar1;
  dVar3 = 0.0;
  for (comp_00 = 0; comp_00 < iVar1; comp_00 = comp_00 + 1) {
    RVar4 = amrex::MultiFab::norm0(rhs,comp_00,0,false,true);
    dVar3 = dVar3 + RVar4 * (1.0 / dVar2);
    iVar1 = (rhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  }
  return dVar3 * reduction;
}

Assistant:

Real
Diffusion::get_scaled_abs_tol (const MultiFab& rhs,
                               Real            reduction) //const
{
    Real oncomp(1.0/rhs.nComp());
    Real rhs_avg_norm(0.0);
    // Let's take an average on all the components
    // This is the only way I can think of to prevent absolute tolerance to be
    // execessively small
    for (int comp(0); comp < rhs.nComp(); ++comp)
        rhs_avg_norm += oncomp * rhs.norm0(comp,0,false,true);
    return reduction * rhs_avg_norm;
}